

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper2.cpp
# Opt level: O0

void test_cpp_wrapper_all_records
               (planck_unit_test_t *tc,Dictionary<int,_int> *dict,int random_positive_num)

{
  long lVar1;
  int *expected_records;
  int key;
  int expected_num_records;
  Dictionary<int,_int> *dict_00;
  Dictionary<int,_int> *tc_00;
  undefined8 uStack_50;
  int aiStack_48 [2];
  int *local_40;
  int local_34;
  ulong uStack_30;
  int i;
  unsigned_long __vla_expr0;
  int local_1c;
  Dictionary<int,_int> *pDStack_18;
  int random_positive_num_local;
  Dictionary<int,_int> *dict_local;
  planck_unit_test_t *tc_local;
  
  __vla_expr0 = (unsigned_long)aiStack_48;
  uStack_30 = (ulong)(uint)random_positive_num;
  lVar1 = -(uStack_30 * 4 + 0xf & 0xfffffffffffffff0);
  local_40 = (int *)((long)aiStack_48 + lVar1);
  local_1c = random_positive_num;
  pDStack_18 = dict;
  dict_local = (Dictionary<int,_int> *)tc;
  for (local_34 = 0; tc_00 = dict_local, dict_00 = pDStack_18, expected_num_records = local_1c,
      key = local_34, expected_records = local_40, local_34 < local_1c; local_34 = local_34 + 1) {
    *(undefined8 *)((long)&uStack_50 + lVar1) = 0x10d0e2;
    cpp_wrapper_insert((planck_unit_test_t *)tc_00,dict_00,key,key,'\x01');
    local_40[local_34] = local_34;
  }
  *(undefined8 *)((long)&uStack_50 + lVar1) = 0x10d115;
  cpp_wrapper_all_records
            ((planck_unit_test_t *)tc_00,dict_00,expected_records,expected_num_records,'\x01');
  return;
}

Assistant:

void
test_cpp_wrapper_all_records(
	planck_unit_test_t *tc,
	Dictionary<int, int> *dict,
	int random_positive_num
) {
	int records[random_positive_num];

	for (int i = 0; i < random_positive_num; i++) {
		cpp_wrapper_insert(tc, dict, i, i, boolean_true);
		records[i] = i;
	}

	cpp_wrapper_all_records(tc, dict, records, random_positive_num, boolean_true);
}